

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_triangles_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::TriangleMeshNode> *tmesh)

{
  pointer *ppQVar1;
  undefined8 uVar2;
  uint a0;
  pointer pvVar3;
  uint uVar4;
  uint uVar5;
  QuadMeshNode *this_00;
  TriangleMeshNode *pTVar6;
  pointer pTVar7;
  pair<int,_int> pVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  iterator iVar12;
  ulong uVar13;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  pointer __x;
  Quad local_78;
  Ref<embree::SceneGraph::TriangleMeshNode> *local_68;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *local_60;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  Node *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar14;
  
  local_50 = (Node *)this;
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  pTVar6 = tmesh->ptr;
  local_58.ptr = (pTVar6->material).ptr;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    pTVar6 = tmesh->ptr;
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_58,pTVar6->time_range,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pTVar6 = tmesh->ptr;
  __x = (pTVar6->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (pTVar6->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar3) {
    do {
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(&this_00->positions,__x);
      __x = __x + 1;
    } while (__x != pvVar3);
    pTVar6 = tmesh->ptr;
  }
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::operator=(&this_00->normals,&pTVar6->normals);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            (&this_00->texcoords,&tmesh->ptr->texcoords);
  pTVar7 = (tmesh->ptr->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(tmesh->ptr->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7;
  if (lVar10 != 0) {
    uVar11 = (lVar10 >> 2) * -0x5555555555555555;
    local_60 = &this_00->quads;
    uVar13 = 0;
    local_68 = tmesh;
    do {
      a0 = pTVar7[uVar13].v0;
      uVar2._0_4_ = pTVar7[uVar13].v1;
      uVar2._4_4_ = pTVar7[uVar13].v2;
      uVar14 = uVar13 + 1;
      if (uVar14 == uVar11) {
        iVar12._M_current =
             (this_00->quads).
             super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this_00->quads).
            super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_78.v0 = a0;
          local_78.v1 = (undefined4)uVar2;
          local_78.v2 = uVar2._4_4_;
          local_78.v3 = uVar2._4_4_;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78);
          uVar14 = uVar13;
          uVar4 = local_78.v1;
          uVar5 = local_78.v2;
        }
        else {
          (iVar12._M_current)->v0 = a0;
          (iVar12._M_current)->v1 = (undefined4)uVar2;
          (iVar12._M_current)->v2 = uVar2._4_4_;
          (iVar12._M_current)->v3 = uVar2._4_4_;
          ppQVar1 = &(this_00->quads).
                     super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppQVar1 = *ppQVar1 + 1;
          uVar14 = uVar13;
          local_78.v0 = a0;
          uVar4 = (undefined4)uVar2;
          uVar5 = uVar2._4_4_;
          local_78.v3 = uVar2._4_4_;
        }
      }
      else {
        uStack_40 = 0;
        local_48 = uVar2;
        pVar8 = quad_index3(a0,(undefined4)uVar2,uVar2._4_4_,pTVar7[uVar14].v0,pTVar7[uVar14].v1,
                            pTVar7[uVar14].v2);
        uVar5 = local_78.v2;
        uVar4 = local_78.v1;
        local_78.v1 = (uint)local_48;
        local_78.v2 = (uint)((ulong)local_48 >> 0x20);
        tmesh = local_68;
        if ((ulong)pVar8 >> 0x20 == 0xffffffff) {
          iVar12._M_current =
               (this_00->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this_00->quads).
              super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78.v0 = a0;
            local_78.v3 = uVar2._4_4_;
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78);
            uVar14 = uVar13;
            tmesh = local_68;
            uVar4 = local_78.v1;
            uVar5 = local_78.v2;
          }
          else {
            (iVar12._M_current)->v0 = a0;
            (iVar12._M_current)->v1 = local_78.v1;
            (iVar12._M_current)->v2 = local_78.v2;
            (iVar12._M_current)->v3 = uVar2._4_4_;
            ppQVar1 = &(this_00->quads).
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppQVar1 = *ppQVar1 + 1;
            uVar14 = uVar13;
            local_78.v0 = a0;
            uVar4 = local_78.v1;
            uVar5 = local_78.v2;
            local_78.v3 = uVar2._4_4_;
          }
        }
        else {
          uVar9 = pVar8.second;
          switch(pVar8.first) {
          case 0:
            iVar12._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78.v0 = uVar9;
            uVar4 = local_78.v1;
            uVar9 = local_78.v2;
            local_78.v3 = a0;
            if (iVar12._M_current !=
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0014e63f;
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78);
            tmesh = local_68;
            uVar4 = local_78.v1;
            uVar5 = local_78.v2;
            break;
          case 1:
            iVar12._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78.v0 = a0;
            uVar4 = (undefined4)uVar2;
            local_78.v3 = uVar2._4_4_;
            if (iVar12._M_current !=
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0014e63f;
            local_78.v1 = (undefined4)uVar2;
            local_78.v2 = uVar9;
            local_78.v3 = uVar2._4_4_;
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78);
            tmesh = local_68;
            uVar4 = local_78.v1;
            uVar5 = local_78.v2;
            break;
          case 2:
            iVar12._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78.v0 = local_78.v1;
            uVar4 = local_78.v2;
            local_78.v3 = a0;
            if (iVar12._M_current !=
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0014e63f;
            local_78.v0 = local_78.v1;
            local_78.v1 = local_78.v2;
            local_78.v2 = uVar9;
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78);
            tmesh = local_68;
            uVar4 = local_78.v1;
            uVar5 = local_78.v2;
            break;
          case -1:
            iVar12._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_78.v0 = local_78.v1;
            uVar4 = local_78.v2;
            local_78.v3 = a0;
            if (iVar12._M_current ==
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78.v1 = local_78.v2;
              local_78.v2 = uVar9;
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>(local_60,iVar12,&local_78)
              ;
              tmesh = local_68;
              uVar4 = local_78.v1;
              uVar5 = local_78.v2;
            }
            else {
LAB_0014e63f:
              local_78.v2 = uVar9;
              local_78.v1 = uVar4;
              (iVar12._M_current)->v0 = local_78.v0;
              (iVar12._M_current)->v1 = local_78.v1;
              (iVar12._M_current)->v2 = local_78.v2;
              (iVar12._M_current)->v3 = local_78.v3;
              ppQVar1 = &(this_00->quads).
                         super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppQVar1 = *ppQVar1 + 1;
              uVar4 = local_78.v1;
              uVar5 = local_78.v2;
            }
          }
        }
      }
      local_78.v2 = uVar5;
      local_78.v1 = uVar4;
      uVar13 = uVar14 + 1;
      pTVar7 = (tmesh->ptr->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(tmesh->ptr->triangles).
                      super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 2) *
               -0x5555555555555555;
    } while (uVar13 < uVar11);
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_50;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads ( Ref<SceneGraph::TriangleMeshNode> tmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(tmesh->material,tmesh->time_range,0);

    for (auto& p : tmesh->positions)
      qmesh->positions.push_back(p);
    
    qmesh->normals = tmesh->normals;
    qmesh->texcoords = tmesh->texcoords;
    
    for (size_t i=0; i<tmesh->triangles.size(); i++)
    {
      const int a0 = tmesh->triangles[i+0].v0;
      const int a1 = tmesh->triangles[i+0].v1;
      const int a2 = tmesh->triangles[i+0].v2;
      if (i+1 == tmesh->triangles.size()) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      const int b0 = tmesh->triangles[i+1].v0;
      const int b1 = tmesh->triangles[i+1].v1;
      const int b2 = tmesh->triangles[i+1].v2;
      const std::pair<int,int> q = quad_index3(a0,a1,a2,b0,b1,b2);
      const int a3 = q.second;
      if (a3 == -1) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      if      (q.first == -1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0));
      else if (q.first ==  0) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a3,a1,a2,a0));
      else if (q.first ==  1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a3,a2));
      else if (q.first ==  2) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0)); 
      i++;
    }
    return qmesh.dynamicCast<SceneGraph::Node>();
  }